

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

pair<int,_int> __thiscall QTreeViewPrivate::startAndEndColumns(QTreeViewPrivate *this,QRect *rect)

{
  bool bVar1;
  int *__a;
  int *piVar2;
  QTreeViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QTreeView *q;
  int end;
  int start;
  QHeaderView *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffffa0;
  int position;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int local_50;
  int local_4c;
  int local_18;
  int local_14;
  pair<int,_int> local_10;
  long local_8;
  
  position = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  QRect::left((QRect *)0x8f6a92);
  local_14 = QHeaderView::visualIndexAt
                       ((QHeaderView *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                        ,position);
  QRect::right((QRect *)0x8f6abf);
  local_18 = QHeaderView::visualIndexAt
                       ((QHeaderView *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
                        ,position);
  bVar1 = QWidget::isRightToLeft((QWidget *)0x8f6ad9);
  if (bVar1) {
    if (local_14 == -1) {
      local_4c = QHeaderView::count(in_stack_ffffffffffffff90);
      local_4c = local_4c + -1;
    }
    else {
      local_4c = local_14;
    }
    local_14 = local_4c;
    if (local_18 == -1) {
      local_50 = 0;
    }
    else {
      local_50 = local_18;
    }
    local_18 = local_50;
  }
  else {
    if (local_14 == -1) {
      local_14 = 0;
    }
    if (local_18 == -1) {
      local_18 = QHeaderView::count(in_stack_ffffffffffffff90);
      local_18 = local_18 + -1;
    }
  }
  piVar2 = &local_18;
  __a = qMin<int>(&local_14,piVar2);
  piVar2 = qMax<int>(&local_14,piVar2);
  std::pair<int,_int>::pair<int,_int,_true>(&local_10,__a,piVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

std::pair<int,int> QTreeViewPrivate::startAndEndColumns(const QRect &rect) const
{
    Q_Q(const QTreeView);
    int start = header->visualIndexAt(rect.left());
    int end = header->visualIndexAt(rect.right());
    if (q->isRightToLeft()) {
        start = (start == -1 ? header->count() - 1 : start);
        end = (end == -1 ? 0 : end);
    } else {
        start = (start == -1 ? 0 : start);
        end = (end == -1 ? header->count() - 1 : end);
    }
    return std::pair(qMin(start, end), qMax(start, end));
}